

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O3

void __thiscall QTableViewPrivate::clearConnections(QTableViewPrivate *this)

{
  pointer pCVar1;
  Connection *connection;
  pointer pCVar2;
  long lVar3;
  
  lVar3 = 0;
  do {
    QObject::disconnect((Connection *)((long)&(this->modelConnections)._M_elems[0].d_ptr + lVar3));
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x20);
  lVar3 = 0;
  do {
    QObject::disconnect((Connection *)
                        ((long)&(this->verHeaderConnections)._M_elems[0].d_ptr + lVar3));
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x38);
  lVar3 = 0;
  do {
    QObject::disconnect((Connection *)
                        ((long)&(this->horHeaderConnections)._M_elems[0].d_ptr + lVar3));
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x28);
  pCVar1 = (this->dynHorHeaderConnections).
           super__Vector_base<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pCVar2 = (this->dynHorHeaderConnections).
                super__Vector_base<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>
                ._M_impl.super__Vector_impl_data._M_start; pCVar2 != pCVar1; pCVar2 = pCVar2 + 1) {
    QObject::disconnect(pCVar2);
  }
  QObject::disconnect(&this->selectionmodelConnection);
  QObject::disconnect(&this->cornerWidgetConnection);
  return;
}

Assistant:

void QTableViewPrivate::clearConnections()
{
    for (const QMetaObject::Connection &connection : modelConnections)
        QObject::disconnect(connection);
    for (const QMetaObject::Connection &connection : verHeaderConnections)
        QObject::disconnect(connection);
    for (const QMetaObject::Connection &connection : horHeaderConnections)
        QObject::disconnect(connection);
    for (const QMetaObject::Connection &connection : dynHorHeaderConnections)
        QObject::disconnect(connection);
    QObject::disconnect(selectionmodelConnection);
#if QT_CONFIG(abstractbutton)
    QObject::disconnect(cornerWidgetConnection);
#endif
}